

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadUnit_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  ushort uVar1;
  _Map_pointer ppsVar2;
  ostream *poVar3;
  Logger *pLVar4;
  _Elt_pointer psVar5;
  _Elt_pointer psVar6;
  uint t;
  chunk_guard cn;
  uint local_1cc;
  char *local_1c8 [4];
  chunk_guard local_1a8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  
  if (1 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Unit");
    return;
  }
  local_1a8.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  psVar6 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar5 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppsVar2 = (out->nodes).
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  do {
    local_1a8.nfo = nfo;
    local_1a8.reader = reader;
    if (psVar6 == (out->nodes).
                  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[14]>(&local_190,(char (*) [14])0x612818);
      poVar3 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_190,&nfo->id);
      std::operator<<(poVar3," is a child of ");
      poVar3 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar3
                         ,&nfo->parent_id);
      std::operator<<(poVar3," which does not exist");
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar4,local_1c8[0]);
LAB_0046b925:
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
LAB_0046b954:
      chunk_guard::~chunk_guard(&local_1a8);
      return;
    }
    if ((((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_ChunkInfo).id == nfo->parent_id) {
      uVar1 = StreamReader<false,_false>::Get<short>(reader);
      local_1cc = (uint)(short)uVar1;
      if (7 < uVar1) {
        pLVar4 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<unsigned_int>(&local_190,&local_1cc);
        std::operator<<((ostream *)&local_190,
                        " is not a valid value for `Units` attribute in `Unit chunk` ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_190,
                   &nfo->id);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar4,local_1c8[0]);
        ((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        unit_scale = 1.0;
        goto LAB_0046b925;
      }
      ((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      unit_scale = units[local_1cc];
      goto LAB_0046b954;
    }
    psVar6 = psVar6 + 1;
    if (psVar6 == psVar5) {
      psVar6 = ppsVar2[1];
      ppsVar2 = ppsVar2 + 1;
      psVar5 = psVar6 + 0x20;
    }
  } while( true );
}

Assistant:

void COBImporter::ReadUnit_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
     if(nfo.version > 1) {
        return UnsupportedChunk_Binary(reader,nfo,"Unit");
    }

     const chunk_guard cn(nfo,reader);

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=reader.GetI2();
            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t," is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];

            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}